

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

container_t *
container_from_run_range(run_container_t *run,uint32_t min,uint32_t max,uint8_t *typecode_after)

{
  int iVar1;
  undefined1 *in_RCX;
  int in_EDX;
  uint32_t in_ESI;
  int *in_RDI;
  array_container_t *array;
  uint32_t rle_max;
  uint32_t rle_min;
  int32_t i;
  int32_t union_cardinality;
  bitset_container_t *bitset;
  bitset_container_t *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  int local_30;
  int local_2c;
  array_container_t *local_8;
  
  local_8 = (array_container_t *)bitset_container_create();
  *in_RCX = 1;
  local_2c = 0;
  for (local_30 = 0; local_30 < *in_RDI; local_30 = local_30 + 1) {
    in_stack_ffffffffffffffcc = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_30 * 4);
    in_stack_ffffffffffffffc8 =
         in_stack_ffffffffffffffcc + *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_30 * 4);
    bitset_set_lenrange((uint64_t *)local_8->array,in_stack_ffffffffffffffcc,
                        in_stack_ffffffffffffffc8 - in_stack_ffffffffffffffcc);
    local_2c = *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_30 * 4) + 1 + local_2c;
  }
  iVar1 = bitset_lenrange_cardinality
                    ((uint64_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     (uint32_t)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffffc0);
  bitset_set_lenrange((uint64_t *)local_8->array,in_ESI,in_EDX - in_ESI);
  local_8->cardinality = ((in_EDX - in_ESI) + 1 + local_2c) - iVar1;
  if (local_8->cardinality < 0x1001) {
    local_8 = array_container_from_bitset(in_stack_ffffffffffffffc0);
    *in_RCX = 2;
    bitset_container_free((bitset_container_t *)0x156f6c);
  }
  return local_8;
}

Assistant:

container_t *container_from_run_range(const run_container_t *run, uint32_t min,
                                      uint32_t max, uint8_t *typecode_after) {
    // We expect most of the time to end up with a bitset container
    bitset_container_t *bitset = bitset_container_create();
    *typecode_after = BITSET_CONTAINER_TYPE;
    int32_t union_cardinality = 0;
    for (int32_t i = 0; i < run->n_runs; ++i) {
        uint32_t rle_min = run->runs[i].value;
        uint32_t rle_max = rle_min + run->runs[i].length;
        bitset_set_lenrange(bitset->words, rle_min, rle_max - rle_min);
        union_cardinality += run->runs[i].length + 1;
    }
    union_cardinality += max - min + 1;
    union_cardinality -=
        bitset_lenrange_cardinality(bitset->words, min, max - min);
    bitset_set_lenrange(bitset->words, min, max - min);
    bitset->cardinality = union_cardinality;
    if (bitset->cardinality <= DEFAULT_MAX_SIZE) {
        // we need to convert to an array container
        array_container_t *array = array_container_from_bitset(bitset);
        *typecode_after = ARRAY_CONTAINER_TYPE;
        bitset_container_free(bitset);
        return array;
    }
    return bitset;
}